

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O0

int __thiscall
glcts::SampleShadingRenderTests::init(SampleShadingRenderTests *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  Context *pCVar2;
  bool bVar3;
  int extraout_EAX;
  SampleShadingRenderFormatTests *pSVar4;
  RenderContext *pRVar5;
  TextureFormat local_4c;
  ApiType local_44;
  char *local_40;
  char *extension;
  TextureFormat local_2c [2];
  TextureFormat local_18;
  SampleShadingRenderTests *local_10;
  SampleShadingRenderTests *this_local;
  
  local_10 = this;
  pSVar4 = (SampleShadingRenderFormatTests *)operator_new(0xf0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TextureFormat::TextureFormat(&local_18,RGBA,UNORM_INT8);
  SampleShadingRenderFormatTests::SampleShadingRenderFormatTests
            (pSVar4,pCVar2,GVar1,0x8058,"rgba8",&local_18,"sampler2DMS","vec4",0.0,1.0,"");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  pSVar4 = (SampleShadingRenderFormatTests *)operator_new(0xf0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TextureFormat::TextureFormat(local_2c,RGBA,SIGNED_INT8);
  SampleShadingRenderFormatTests::SampleShadingRenderFormatTests
            (pSVar4,pCVar2,GVar1,0x8d8e,"rgba8i",local_2c,"isampler2DMS","ivec4",-128.0,127.0,"");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  pSVar4 = (SampleShadingRenderFormatTests *)operator_new(0xf0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TextureFormat::TextureFormat((TextureFormat *)((long)&extension + 4),RGBA,UNSIGNED_INT8);
  SampleShadingRenderFormatTests::SampleShadingRenderFormatTests
            (pSVar4,pCVar2,GVar1,0x8d7c,"rgba8ui",(TextureFormat *)((long)&extension + 4),
             "usampler2DMS","uvec4",0.0,255.0,"");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  local_44.m_bits = (*pRVar5->_vptr_RenderContext[2])();
  bVar3 = glu::isContextTypeES((ContextType)local_44.m_bits);
  local_40 = "";
  if (bVar3) {
    local_40 = "GL_EXT_color_buffer_float";
  }
  pSVar4 = (SampleShadingRenderFormatTests *)operator_new(0xf0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TextureFormat::TextureFormat(&local_4c,RGBA,FLOAT);
  SampleShadingRenderFormatTests::SampleShadingRenderFormatTests
            (pSVar4,pCVar2,GVar1,0x8814,"rgba32f",&local_4c,"sampler2DMS","vec4",0.0,1.0,local_40);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  return extraout_EAX;
}

Assistant:

void SampleShadingRenderTests::init(void)
{
	// sample_shading.render.rgba8
	addChild(new SampleShadingRenderFormatTests(
		m_context, m_glslVersion, GL_RGBA8, "rgba8",
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), "sampler2DMS", "vec4", 0.0, 1.0));
	// sample_shading.render.rgba8i
	addChild(new SampleShadingRenderFormatTests(
		m_context, m_glslVersion, GL_RGBA8I, "rgba8i",
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::SIGNED_INT8), "isampler2DMS", "ivec4", -128.0,
		127.0));
	// sample_shading.render.rgba8ui
	addChild(new SampleShadingRenderFormatTests(
		m_context, m_glslVersion, GL_RGBA8UI, "rgba8ui",
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT8), "usampler2DMS", "uvec4", 0.0,
		255.0));
	// sample_shading.render.rgba32f
	const char* extension =
		(glu::isContextTypeES(m_context.getRenderContext().getType())) ? "GL_EXT_color_buffer_float" : "";
	addChild(new SampleShadingRenderFormatTests(m_context, m_glslVersion, GL_RGBA32F, "rgba32f",
												tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT),
												"sampler2DMS", "vec4", 0.0, 1.0, extension));
}